

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# demangle_unittest.cc
# Opt level: O0

void Test_Demangle_Clones::RunTest(void)

{
  bool bVar1;
  int iVar2;
  char local_28 [8];
  char tmp [20];
  
  bVar1 = google::Demangle("_ZL3Foov",local_28,0x14);
  if (!bVar1) {
    fprintf(_stderr,"Check failed: %s\n","Demangle(\"_ZL3Foov\", tmp, sizeof(tmp))");
    exit(1);
  }
  iVar2 = strcmp("Foo()",local_28);
  if (iVar2 != 0) {
    fprintf(_stderr,"Check failed: streq(%s, %s)\n","\"Foo()\"","tmp");
    exit(1);
  }
  bVar1 = google::Demangle("_ZL3Foov.clone.3",local_28,0x14);
  if (!bVar1) {
    fprintf(_stderr,"Check failed: %s\n","Demangle(\"_ZL3Foov.clone.3\", tmp, sizeof(tmp))");
    exit(1);
  }
  iVar2 = strcmp("Foo()",local_28);
  if (iVar2 != 0) {
    fprintf(_stderr,"Check failed: streq(%s, %s)\n","\"Foo()\"","tmp");
    exit(1);
  }
  bVar1 = google::Demangle("_ZL3Foov.constprop.80",local_28,0x14);
  if (!bVar1) {
    fprintf(_stderr,"Check failed: %s\n","Demangle(\"_ZL3Foov.constprop.80\", tmp, sizeof(tmp))");
    exit(1);
  }
  iVar2 = strcmp("Foo()",local_28);
  if (iVar2 != 0) {
    fprintf(_stderr,"Check failed: streq(%s, %s)\n","\"Foo()\"","tmp");
    exit(1);
  }
  bVar1 = google::Demangle("_ZL3Foov.isra.18",local_28,0x14);
  if (!bVar1) {
    fprintf(_stderr,"Check failed: %s\n","Demangle(\"_ZL3Foov.isra.18\", tmp, sizeof(tmp))");
    exit(1);
  }
  iVar2 = strcmp("Foo()",local_28);
  if (iVar2 != 0) {
    fprintf(_stderr,"Check failed: streq(%s, %s)\n","\"Foo()\"","tmp");
    exit(1);
  }
  bVar1 = google::Demangle("_ZL3Foov.isra.2.constprop.18",local_28,0x14);
  if (!bVar1) {
    fprintf(_stderr,"Check failed: %s\n",
            "Demangle(\"_ZL3Foov.isra.2.constprop.18\", tmp, sizeof(tmp))");
    exit(1);
  }
  iVar2 = strcmp("Foo()",local_28);
  if (iVar2 != 0) {
    fprintf(_stderr,"Check failed: streq(%s, %s)\n","\"Foo()\"","tmp");
    exit(1);
  }
  bVar1 = google::Demangle("_ZL3Foov.clo",local_28,0x14);
  if (bVar1) {
    fprintf(_stderr,"Check failed: %s\n","!(Demangle(\"_ZL3Foov.clo\", tmp, sizeof(tmp)))");
    exit(1);
  }
  bVar1 = google::Demangle("_ZL3Foov.clone.",local_28,0x14);
  if (!bVar1) {
    bVar1 = google::Demangle("_ZL3Foov.clone.foo",local_28,0x14);
    if (bVar1) {
      fprintf(_stderr,"Check failed: %s\n","!(Demangle(\"_ZL3Foov.clone.foo\", tmp, sizeof(tmp)))");
      exit(1);
    }
    bVar1 = google::Demangle("_ZL3Foov.isra.2.constprop.",local_28,0x14);
    if (!bVar1) {
      return;
    }
    fprintf(_stderr,"Check failed: %s\n",
            "!(Demangle(\"_ZL3Foov.isra.2.constprop.\", tmp, sizeof(tmp)))");
    exit(1);
  }
  fprintf(_stderr,"Check failed: %s\n","!(Demangle(\"_ZL3Foov.clone.\", tmp, sizeof(tmp)))");
  exit(1);
}

Assistant:

TEST(Demangle, Clones) {
  char tmp[20];
  EXPECT_TRUE(Demangle("_ZL3Foov", tmp, sizeof(tmp)));
  EXPECT_STREQ("Foo()", tmp);
  EXPECT_TRUE(Demangle("_ZL3Foov.clone.3", tmp, sizeof(tmp)));
  EXPECT_STREQ("Foo()", tmp);
  EXPECT_TRUE(Demangle("_ZL3Foov.constprop.80", tmp, sizeof(tmp)));
  EXPECT_STREQ("Foo()", tmp);
  EXPECT_TRUE(Demangle("_ZL3Foov.isra.18", tmp, sizeof(tmp)));
  EXPECT_STREQ("Foo()", tmp);
  EXPECT_TRUE(Demangle("_ZL3Foov.isra.2.constprop.18", tmp, sizeof(tmp)));
  EXPECT_STREQ("Foo()", tmp);
  // Invalid (truncated), should not demangle.
  EXPECT_FALSE(Demangle("_ZL3Foov.clo", tmp, sizeof(tmp)));
  // Invalid (.clone. not followed by number), should not demangle.
  EXPECT_FALSE(Demangle("_ZL3Foov.clone.", tmp, sizeof(tmp)));
  // Invalid (.clone. followed by non-number), should not demangle.
  EXPECT_FALSE(Demangle("_ZL3Foov.clone.foo", tmp, sizeof(tmp)));
  // Invalid (.constprop. not followed by number), should not demangle.
  EXPECT_FALSE(Demangle("_ZL3Foov.isra.2.constprop.", tmp, sizeof(tmp)));
}